

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O1

RTPTransmissionInfo * __thiscall
jrtplib::RTPExternalTransmitter::GetTransmissionInfo(RTPExternalTransmitter *this)

{
  RTPMemoryManager *pRVar1;
  RTPTransmissionInfo *pRVar2;
  
  if (this->init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      pRVar2 = (RTPTransmissionInfo *)operator_new(0x18);
    }
    else {
      pRVar2 = (RTPTransmissionInfo *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x18,0x1c);
    }
    pRVar2->protocol = ExternalProto;
    pRVar2->_vptr_RTPTransmissionInfo = (_func_int **)&PTR__RTPTransmissionInfo_0013c610;
    pRVar2[1]._vptr_RTPTransmissionInfo = (_func_int **)&this->packetinjector;
    return pRVar2;
  }
  return (RTPTransmissionInfo *)0x0;
}

Assistant:

RTPTransmissionInfo *RTPExternalTransmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPExternalTransmissionInfo(&packetinjector);
	MAINMUTEX_UNLOCK
	return tinf;
}